

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

int __thiscall mkvparser::Track::Info::Copy(Info *this,Info *dst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  Info *in_RSI;
  Info *in_RDI;
  int status_3;
  int status_2;
  int status_1;
  int status;
  Info *str;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RSI == in_RDI) {
    iVar3 = 0;
  }
  else {
    in_RSI->type = in_RDI->type;
    in_RSI->number = in_RDI->number;
    in_RSI->defaultDuration = in_RDI->defaultDuration;
    in_RSI->codecDelay = in_RDI->codecDelay;
    in_RSI->seekPreRoll = in_RDI->seekPreRoll;
    in_RSI->uid = in_RDI->uid;
    in_RSI->lacing = (bool)(in_RDI->lacing & 1);
    (in_RSI->settings).start = (in_RDI->settings).start;
    (in_RSI->settings).size = (in_RDI->settings).size;
    str = in_RDI;
    iVar1 = CopyStr((Info *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                    (offset_in_Info_to_unknown)in_RDI,in_RSI);
    iVar3 = iVar1;
    if ((((iVar1 == 0) &&
         (iVar2 = CopyStr((Info *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          (offset_in_Info_to_unknown)str,in_RSI), iVar3 = iVar2, iVar2 == 0)) &&
        (iVar3 = CopyStr((Info *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (offset_in_Info_to_unknown)str,in_RSI), iVar3 == 0)) &&
       (iVar3 = CopyStr((Info *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        (offset_in_Info_to_unknown)str,in_RSI), iVar3 == 0)) {
      if (in_RDI->codecPrivateSize != 0) {
        if (in_RDI->codecPrivate == (uchar *)0x0) {
          return -1;
        }
        if (in_RSI->codecPrivate != (uchar *)0x0) {
          return -1;
        }
        if (in_RSI->codecPrivateSize != 0) {
          return -1;
        }
        puVar4 = SafeArrayAlloc<unsigned_char>((unsigned_long_long)in_RSI,CONCAT44(iVar1,iVar2));
        in_RSI->codecPrivate = puVar4;
        if (in_RSI->codecPrivate == (uchar *)0x0) {
          return -1;
        }
        memcpy(in_RSI->codecPrivate,in_RDI->codecPrivate,in_RDI->codecPrivateSize);
        in_RSI->codecPrivateSize = in_RDI->codecPrivateSize;
      }
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int Track::Info::Copy(Info& dst) const {
  if (&dst == this)
    return 0;

  dst.type = type;
  dst.number = number;
  dst.defaultDuration = defaultDuration;
  dst.codecDelay = codecDelay;
  dst.seekPreRoll = seekPreRoll;
  dst.uid = uid;
  dst.lacing = lacing;
  dst.settings = settings;

  // We now copy the string member variables from src to dst.
  // This involves memory allocation so in principle the operation
  // can fail (indeed, that's why we have Info::Copy), so we must
  // report this to the caller.  An error return from this function
  // therefore implies that the copy was only partially successful.

  if (int status = CopyStr(&Info::nameAsUTF8, dst))
    return status;

  if (int status = CopyStr(&Info::language, dst))
    return status;

  if (int status = CopyStr(&Info::codecId, dst))
    return status;

  if (int status = CopyStr(&Info::codecNameAsUTF8, dst))
    return status;

  if (codecPrivateSize > 0) {
    if (codecPrivate == NULL)
      return -1;

    if (dst.codecPrivate)
      return -1;

    if (dst.codecPrivateSize != 0)
      return -1;

    dst.codecPrivate = SafeArrayAlloc<unsigned char>(1, codecPrivateSize);

    if (dst.codecPrivate == NULL)
      return -1;

    memcpy(dst.codecPrivate, codecPrivate, codecPrivateSize);
    dst.codecPrivateSize = codecPrivateSize;
  }

  return 0;
}